

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshIO.hh
# Opt level: O1

bool OpenMesh::IO::read_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
               (PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *_mesh,string *_filename,
               Options *_opt,bool _clear)

{
  undefined1 uVar1;
  _IOManager_ *this;
  undefined7 in_register_00000009;
  IO *this_00;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> importer;
  BaseImporter local_70;
  PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *local_68;
  _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>_>_>
  local_60;
  
  this_00 = (IO *)_mesh;
  if ((int)CONCAT71(in_register_00000009,_clear) != 0) {
    ArrayKernel::clear((ArrayKernel *)_mesh);
  }
  local_70._vptr_BaseImporter = (_func_int **)&PTR__ImporterT_001b2670;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl._0_8_ = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = _mesh;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  this = (_IOManager_ *)IOManager(this_00);
  uVar1 = _IOManager_::read(this,(string *)_filename,&local_70,_opt);
  local_70._vptr_BaseImporter = (_func_int **)&PTR__ImporterT_001b2670;
  std::
  _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<float,_3>_>_>_>
  ::~_Rb_tree(&local_60);
  return (bool)uVar1;
}

Assistant:

bool
read_mesh(Mesh&         _mesh,
	  const std::string&  _filename,
	  Options&            _opt,
	  bool                _clear = true)
{
  if (_clear) _mesh.clear();
  ImporterT<Mesh> importer(_mesh);
  return IOManager().read(_filename, importer, _opt);
}